

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ShellANCF_Jacobian::Evaluate
          (ShellANCF_Jacobian *this,ChVectorN<double,_696> *result,double x,double y,double z)

{
  long col;
  double dVar1;
  Scalar SVar2;
  Scalar SVar3;
  Scalar SVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [32];
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  undefined8 uVar65;
  undefined8 uVar66;
  ChVectorN<double,_696> *vector;
  Scalar *pSVar67;
  Scalar *pSVar68;
  Scalar *pSVar69;
  Scalar *pSVar70;
  Scalar *pSVar71;
  Scalar *pSVar72;
  Scalar *pSVar73;
  int j_2;
  ChElementShellANCF_3423 *pCVar74;
  int j;
  long lVar75;
  ulong uVar76;
  ChMatrixNM<double,_6,_6> *pCVar77;
  int i_3;
  long lVar78;
  int i;
  long lVar79;
  bool bVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  undefined8 in_XMM0_Qb;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  CoeffReturnType CVar98;
  CoeffReturnType CVar99;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined8 in_XMM1_Qb;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  double dVar277;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  ChMatrixNM<double,_3,_3> j0;
  double detJ0;
  ChVectorN<double,_6> DEPS;
  ShapeVector Nx;
  ChVectorN<double,_6> strain;
  ShapeVector Ny;
  ChMatrixNM<double,_1,_3> tempB3;
  ShapeVector Nz;
  ChMatrixNM<double,_1,_3> tempB31;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_24> tempB;
  ChVectorN<double,_8> ddNy;
  ShapeVector N;
  ChVectorN<double,_6> strain_EAS;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ChVectorN<double,_8> d0d0Ny;
  ChVectorN<double,_8> d0d0Nx;
  ChVectorN<double,_8> ddNx;
  ChVectorN<double,_6> stress;
  ChMatrixNM<double,_6,_5> G;
  ChMatrixNM<double,_6,_5> M;
  ChMatrixNM<double,_6,_24> strainD_til;
  ChMatrixNM<double,_9,_24> Gd;
  ChMatrixNM<double,_24,_24> KTE;
  ChMatrixNM<double,_6,_24> strainD;
  ChMatrixNM<double,_5,_24> GDEPSP;
  ChMatrixNM<double,_9,_9> Sigm;
  undefined1 local_3060 [16];
  ulong uStack_3050;
  double dStack_3048;
  undefined1 local_3040 [16];
  ulong local_3030;
  undefined1 local_3028 [16];
  double local_3018;
  ulong local_3010;
  ulong local_3008;
  ulong local_3000;
  ulong local_2ff8;
  ulong local_2ff0;
  ulong local_2fe8;
  ChVectorN<double,_696> *local_2fd8;
  ulong local_2fd0;
  ulong local_2fc8;
  ulong local_2fc0;
  ulong local_2fb8;
  ulong local_2fb0;
  ulong local_2fa8;
  undefined1 local_2fa0 [16];
  ulong uStack_2f90;
  double dStack_2f88;
  undefined1 local_2f80 [80];
  undefined1 local_2f30 [16];
  double local_2f20;
  double local_2f18;
  double local_2f10;
  double local_2f08;
  undefined1 local_2f00 [80];
  DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *local_2eb0;
  ChMatrixNM<double,_6,_6> *local_2ea8;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *local_2ea0;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> local_2e98 [24];
  ShapeVector local_2e80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>,_0>,_Eigen::Matrix<double,_9,_24,_1,_9,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
  local_2e18;
  Matrix<double,_1,_3,_1,_1,_3> local_2de8;
  ChMatrixNM<double,_1,_3> local_2dd0;
  undefined1 local_2db8 [32];
  scalar_constant_op<double> local_2d98;
  Matrix<double,_1,_24,_1,_1,_24> local_2d80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_2cc0 [4];
  ShapeVector local_2c80;
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> local_2c20 [48];
  undefined1 local_2bf0 [16];
  double local_2be0;
  ChMatrixNM<double,_1,_3> local_2bd0;
  ChMatrixNM<double,_1,_3> local_2bb0;
  element_type **local_2b98;
  DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *local_2b90;
  element_type **local_2b88;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_2b80 [64];
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_2b40 [64];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_2b00 [7];
  undefined8 local_2a90;
  undefined8 local_2a88;
  undefined8 local_2a80;
  undefined8 local_2a78;
  undefined8 local_2a70;
  undefined8 local_2a68;
  undefined1 local_2a60 [480];
  Matrix<double,_6,_24,_1,_6,_24> local_2880;
  element_type *local_2400;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *local_23f8;
  Matrix<double,_9,_24,_1,_9,_24> local_1d40 [2];
  DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> local_b40 [1152];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_24,_1,_6,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>,_0>,_Eigen::Matrix<double,_9,_24,_1,_9,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>_>
  local_6c0 [8];
  undefined8 local_300 [3];
  undefined8 local_2e8;
  undefined8 local_2d0;
  undefined8 local_2b0;
  undefined8 local_298;
  undefined8 local_280;
  undefined8 local_260;
  undefined8 local_248;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_210;
  undefined8 local_1f8;
  undefined8 local_1d8;
  undefined8 local_1c0;
  undefined8 local_1a8;
  undefined8 local_188;
  undefined8 local_170;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_138;
  undefined8 local_120;
  undefined8 local_100;
  undefined8 local_e8;
  undefined8 local_d0;
  undefined8 local_b0;
  undefined8 local_98;
  undefined8 local_80;
  undefined1 auVar225 [32];
  undefined1 auVar282 [32];
  undefined1 auVar286 [32];
  
  pCVar74 = this->m_element;
  local_2fd8 = result;
  ChElementShellANCF_3423::ShapeFunctions(pCVar74,&local_2c80,x,y,z);
  local_3018 = ChElementShellANCF_3423::Calc_detJ0
                         (pCVar74,x,y,z,(ShapeVector *)local_2f80,(ShapeVector *)local_2f00,
                          &local_2e80,&local_2bb0,&local_2bd0,&local_2dd0);
  auVar85._8_8_ = in_XMM1_Qb;
  auVar85._0_8_ = y;
  auVar83._8_8_ = in_XMM0_Qb;
  auVar83._0_8_ = x;
  auVar81 = vunpcklpd_avx(auVar83,auVar85);
  auVar291 = vpermpd_avx2(ZEXT1632(auVar81),0x50);
  auVar239._16_16_ = _DAT_00ef8bf0;
  auVar239._0_16_ = _DAT_00ef8bf0;
  auVar61._8_8_ = 0x3fe0000000000000;
  auVar61._0_8_ = 0x3fe0000000000000;
  auVar61._16_8_ = 0x3fe0000000000000;
  auVar61._24_8_ = 0x3fe0000000000000;
  _local_2fa0 = vfmadd213pd_avx512vl(auVar239,auVar291,auVar61);
  ChElementShellANCF_3423::Basis_M(pCVar74,(ChMatrixNM<double,_6,_5> *)(local_2a60 + 0xf0),x,y,z);
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar250._8_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar250._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar265._8_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar265._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar92._8_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar92._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar90._8_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar90._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar81 = vunpcklpd_avx(auVar250,auVar166);
  auVar82 = vunpcklpd_avx(auVar265,auVar100);
  auVar259._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] * auVar81._0_8_;
  auVar259._8_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] * auVar81._8_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] *
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar81 = vfmsub231sd_fma(auVar101,auVar166,auVar90);
  local_2bf0 = vfmsub213pd_fma(auVar82,auVar92,auVar259);
  local_2be0 = auVar81._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar81 = vfmadd231sd_fma(auVar102,auVar166,auVar166);
  auVar81 = vfmadd231sd_fma(auVar81,auVar250,auVar250);
  auVar81 = vsqrtsd_avx(auVar81,auVar81);
  dVar93 = 1.0 / auVar81._0_8_;
  dVar62 = local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[0] * dVar93;
  dVar63 = local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[1] * dVar93;
  dVar93 = local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[2] * dVar93;
  ChVector<double>::GetNormalized((ChVector<double> *)local_1d40,(ChVector<double> *)local_2bf0);
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[2];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dVar63;
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[1];
  auVar242._8_8_ = 0;
  auVar242._0_8_ = dVar93;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = dVar62;
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[0];
  auVar260._8_8_ = 0;
  auVar260._0_8_ =
       dVar63 * local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.
                m_storage.m_data.array[2];
  auVar88 = vfmsub231sd_fma(auVar260,auVar226,auVar242);
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       dVar62 * local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.
                m_storage.m_data.array[1];
  auVar89 = vfmsub231sd_fma(auVar227,auVar103,auVar251);
  dVar1 = (this->m_element->m_layers).
          super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
          ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_theta;
  auVar243._8_8_ = 0;
  auVar243._0_8_ =
       dVar93 * local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.
                m_storage.m_data.array[0];
  auVar82 = vfmsub231sd_fma(auVar243,auVar167,auVar266);
  dVar94 = cos(dVar1);
  dVar95 = sin(dVar1);
  dVar60 = dVar95 * auVar82._0_8_ + dVar94 * dVar63;
  dVar96 = sin(dVar1);
  dVar97 = cos(dVar1);
  auVar91._8_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar91._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar285._8_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar285._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar286._16_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar286._0_16_ = auVar285;
  auVar286._24_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar283._8_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar283._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar271._8_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar271._0_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar291._8_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar291._0_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar291._16_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar291._24_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar81 = vunpcklpd_avx(auVar283,auVar285);
  auVar291 = vblendpd_avx(ZEXT1632(auVar81),auVar291,0xc);
  dVar1 = dVar97 * auVar82._0_8_ - dVar96 * dVar63;
  dVar63 = dVar97 * auVar89._0_8_ - dVar96 * dVar93;
  auVar168._8_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar168._0_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar225._16_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar225._0_16_ = auVar168;
  auVar225._24_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar86._8_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar86._0_8_ =
       local_2dd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar82 = vunpcklpd_avx(auVar168,auVar91);
  auVar84 = vunpcklpd_avx(auVar271,auVar168);
  auVar81 = vunpcklpd_avx(auVar168,auVar86);
  auVar61 = vblendpd_avx(ZEXT1632(auVar86),auVar225,4);
  auVar87._8_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar87._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar239 = vpermpd_avx2(auVar61,0x24);
  auVar165._8_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar165._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar165._16_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar165._24_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar281._16_16_ = auVar87;
  auVar281._0_16_ = auVar81;
  auVar240._16_16_ = auVar91;
  auVar240._0_16_ = auVar81;
  auVar61 = vblendpd_avx(ZEXT1632(auVar87),auVar286,4);
  auVar225 = vblendpd_avx(auVar281,auVar240,10);
  auVar61 = vblendpd_avx(auVar61,auVar165,8);
  auVar261._0_8_ =
       -local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[2];
  auVar261._8_8_ =
       -local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[2];
  auVar278._0_8_ = -auVar225._0_8_;
  auVar278._8_8_ = -auVar225._8_8_;
  auVar282._16_8_ = -auVar225._16_8_;
  auVar282._0_16_ = auVar278;
  auVar282._24_8_ = -auVar225._24_8_;
  auVar241._0_8_ = auVar291._0_8_ * auVar225._0_8_;
  auVar241._8_8_ = auVar291._8_8_ * auVar225._8_8_;
  auVar241._16_8_ = auVar291._16_8_ * auVar225._16_8_;
  auVar241._24_8_ = auVar291._24_8_ * auVar225._24_8_;
  auVar252._0_8_ =
       -local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[0];
  auVar252._8_8_ =
       -local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[1];
  auVar81 = vfmsub231pd_fma(auVar241,auVar239,auVar61);
  auVar64 = vunpcklpd_avx(auVar252,auVar282._16_16_);
  _local_3060 = vpermpd_avx2(ZEXT1632(auVar81),0xc9);
  auVar81 = vblendpd_avx(auVar261,auVar278,2);
  auVar228._0_8_ = auVar82._0_8_ * auVar81._0_8_;
  auVar228._8_8_ = auVar82._8_8_ * auVar81._8_8_;
  local_3040 = vfmadd231pd_fma(auVar228,auVar91,auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar229._8_8_ = 0;
  auVar229._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar81 = vfmsub231sd_fma(auVar229,auVar285,auVar81);
  auVar104._8_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar104._0_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_3030 = auVar81._0_8_;
  auVar230._0_8_ =
       local_2bd0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] * auVar64._0_8_;
  auVar230._8_8_ =
       local_2bb0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] * auVar64._8_8_;
  local_3028 = vfmadd213pd_fma(auVar104,auVar87,auVar230);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_3060,&local_3018);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = local_3060._8_8_;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = local_3060._0_8_;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = dVar95 * auVar88._0_8_ + dVar94 * dVar62;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uStack_3050;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = dVar95 * auVar89._0_8_ + dVar94 * dVar93;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = dVar97 * auVar88._0_8_ - dVar96 * dVar62;
  auVar284._8_8_ = 0;
  auVar284._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[0];
  auVar253._8_8_ = 0;
  auVar253._0_8_ = local_3040._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dStack_3048;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = local_3040._8_8_;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = local_3028._0_8_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = local_3030;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = local_3028._8_8_;
  local_2400 = (element_type *)
               &(this->m_element->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_T0;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = dVar60 * (double)local_3060._8_8_;
  auVar81 = vfmadd231sd_fma(auVar279,auVar287,auVar231);
  auVar81 = vfmadd231sd_fma(auVar81,auVar289,auVar267);
  dVar97 = auVar81._0_8_;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = dVar1;
  auVar81 = vmulsd_avx512f(auVar299,auVar244);
  auVar81 = vfmadd231sd_fma(auVar81,auVar293,auVar231);
  auVar245._8_8_ = 0;
  auVar245._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[1] * (double)local_3060._8_8_;
  auVar82 = vfmadd231sd_fma(auVar245,auVar284,auVar231);
  auVar294._8_8_ = 0;
  auVar294._0_8_ = dVar63;
  auVar81 = vfmadd231sd_avx512f(auVar81,auVar294,auVar267);
  dVar277 = auVar81._0_8_;
  auVar280._8_8_ = 0;
  auVar280._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[2];
  auVar81 = vfmadd231sd_fma(auVar82,auVar280,auVar267);
  auVar82 = vmulsd_avx512f(auVar299,auVar253);
  auVar82 = vfmadd231sd_fma(auVar82,auVar293,auVar105);
  dVar93 = auVar81._0_8_;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = dVar60 * (double)local_3040._0_8_;
  auVar81 = vfmadd231sd_fma(auVar246,auVar287,auVar105);
  auVar82 = vfmadd231sd_avx512f(auVar82,auVar294,auVar269);
  auVar81 = vfmadd231sd_fma(auVar81,auVar289,auVar269);
  dVar96 = auVar82._0_8_;
  dVar94 = auVar81._0_8_;
  auVar247._8_8_ = 0;
  auVar247._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[1] * (double)local_3040._0_8_;
  auVar81 = vfmadd231sd_fma(auVar247,auVar284,auVar105);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar60 * (double)local_3028._0_8_;
  auVar82 = vfmadd231sd_fma(auVar106,auVar169,auVar287);
  auVar81 = vfmadd231sd_fma(auVar81,auVar280,auVar269);
  auVar82 = vfmadd231sd_fma(auVar82,auVar272,auVar289);
  dVar95 = auVar81._0_8_;
  auVar113._0_8_ = auVar82._0_8_;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = dVar1;
  auVar81 = vmulsd_avx512f(auVar300,auVar262);
  auVar81 = vfmadd231sd_fma(auVar81,auVar169,auVar293);
  auVar295._8_8_ = 0;
  auVar295._0_8_ = dVar63;
  auVar81 = vfmadd231sd_avx512f(auVar81,auVar272,auVar295);
  auVar118._0_8_ = auVar81._0_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data
       .array[1] * (double)local_3028._0_8_;
  auVar81 = vfmadd231sd_fma(auVar107,auVar284,auVar169);
  auVar81 = vfmadd231sd_fma(auVar81,auVar280,auVar272);
  auVar128._0_8_ = auVar81._0_8_;
  local_23f8 = (PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)(local_2a60 + 0xf0);
  local_2880.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
  [0] = *(double *)((long)local_2400 + -0x120 + 0x108) / local_3018;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,5,1,6,5>,0>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>
             *)local_1d40,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,5,1,6,5>,0>>
             *)&local_2400,(double *)&local_2880);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,5,1,6,5>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,5,1,6,5>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,5,0,6,5>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,6,5,1,6,5>> *)local_2a60,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>
              *)local_1d40);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)((this->m_element->m_alphaEAS).
                      super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + this->m_kl);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)local_2a60;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,5,1,6,5>,Eigen::Matrix<double,5,1,0,5,1>,0>>
            (local_2c20,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_5,_1,_6,_5>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_0>_>
              *)local_1d40);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2f80;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)&this->m_element->m_ddT;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_2b00,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1d40);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)&this->m_element->m_ddT;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2f00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_2cc0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1d40);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)&this->m_element->m_d0d0T;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2f80;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (local_2b40,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1d40);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)&this->m_element->m_d0d0T;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2f00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (local_2b80,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)local_1d40);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2b00;
  lVar78 = 0;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)local_2f80;
  CVar98 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)local_1d40,0,0);
  local_23f8 = local_2b40;
  local_2400 = (element_type *)local_2f80;
  CVar99 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)&local_2400,0,0);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2cc0;
  dVar1 = (CVar98 - CVar99) * 0.5;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)local_2f00;
  CVar98 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)local_1d40,0,0);
  local_2400 = (element_type *)local_2f00;
  local_23f8 = local_2b80;
  CVar99 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)&local_2400,0,0);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)local_2f80;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2cc0;
  dVar60 = (CVar98 - CVar99) * 0.5;
  CVar98 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)local_1d40,0,0);
  local_2400 = (element_type *)local_2f80;
  local_23f8 = local_2b80;
  CVar99 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)&local_2400,0,0);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = dVar60;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = dVar1;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = local_2fa0._0_8_;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = dVar96;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar277;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = dVar93;
  auVar248._8_8_ = 0;
  auVar248._0_8_ =
       local_2c80.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  pCVar74 = this->m_element;
  dVar62 = CVar98 - CVar99;
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       local_2c80.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar304._8_8_ = 0;
  auVar304._0_8_ = dVar94;
  auVar81 = vmulsd_avx512f(auVar304,auVar270);
  auVar83 = vaddsd_avx512f(auVar270,auVar270);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = dVar97;
  auVar82 = vmulsd_avx512f(auVar296,auVar292);
  auVar301._8_8_ = 0;
  auVar301._0_8_ = auVar118._0_8_;
  auVar84 = vmulsd_avx512f(auVar296,auVar301);
  auVar85 = vmulsd_avx512f(auVar304,auVar81);
  auVar305._8_8_ = 0;
  auVar305._0_8_ = dVar94;
  auVar86 = vfmadd231sd_avx512f(auVar82,auVar288,auVar305);
  auVar307._8_8_ = 0;
  auVar307._0_8_ = auVar113._0_8_;
  auVar87 = vfmadd231sd_avx512f(auVar84,auVar288,auVar307);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[0];
  auVar232._8_8_ = 0;
  auVar232._0_8_ =
       local_2c80.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2] *
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[1];
  auVar81 = vfmadd231sd_fma(auVar232,auVar170,auVar82);
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       local_2c80.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[2];
  auVar81 = vfmadd132sd_fma(auVar171,auVar81,auVar84);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uStack_2f90;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[3];
  auVar81 = vfmadd132sd_fma(auVar248,auVar81,auVar64);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[6];
  auVar172._8_8_ = 0;
  auVar172._0_8_ =
       dStack_2f88 *
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[7];
  auVar84 = vfmadd231sd_fma(auVar172,auVar233,auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[4];
  auVar234._8_8_ = 0;
  auVar234._0_8_ =
       (double)local_2fa0._8_8_ *
       (pCVar74->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[5];
  auVar64 = vfmadd231sd_fma(auVar234,auVar254,auVar89);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = dVar97;
  auVar82 = vmulsd_avx512f(auVar297,auVar268);
  auVar82 = vfmadd231sd_avx512f(auVar85,auVar297,auVar82);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar62;
  auVar88 = vmulsd_avx512f(auVar297,auVar108);
  auVar89 = vaddsd_avx512f(auVar81,auVar81);
  auVar85 = vmulsd_avx512f(auVar307,auVar89);
  auVar82 = vfmadd213sd_avx512f(auVar88,auVar305,auVar82);
  auVar308._8_8_ = 0;
  auVar308._0_8_ = auVar113._0_8_;
  auVar88 = vmulsd_avx512f(auVar308,auVar81);
  auVar82 = vfmadd213sd_avx512f(auVar88,auVar308,auVar82);
  auVar88 = vmulsd_avx512f(auVar297,auVar84);
  auVar82 = vfmadd213sd_avx512f(auVar88,auVar308,auVar82);
  auVar88 = vmulsd_avx512f(auVar305,auVar64);
  auVar82 = vfmadd213sd_avx512f(auVar88,auVar308,auVar82);
  local_2f30._0_8_ = auVar82._0_8_;
  auVar88 = vmulsd_avx512f(auVar305,auVar83);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar277 * dVar1;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dVar96 * dVar96 * dVar60;
  auVar82 = vfmadd231sd_fma(auVar263,auVar288,auVar255);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar277 * dVar62;
  auVar82 = vfmadd213sd_fma(auVar256,auVar292,auVar82);
  auVar90 = vmulsd_avx512f(auVar301,auVar81);
  auVar302._8_8_ = 0;
  auVar302._0_8_ = auVar118._0_8_;
  auVar82 = vfmadd213sd_avx512f(auVar90,auVar302,auVar82);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = dVar277 * auVar84._0_8_;
  auVar82 = vfmadd213sd_avx512f(auVar257,auVar302,auVar82);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar96 * auVar64._0_8_;
  auVar82 = vfmadd213sd_avx512f(auVar264,auVar302,auVar82);
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar1 + dVar1;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = dVar97;
  auVar90 = vmulsd_avx512f(auVar298,auVar258);
  local_2f30._8_8_ = auVar82._0_8_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar96 * auVar88._0_8_;
  auVar82 = vfmadd231sd_fma(auVar273,auVar90,auVar288);
  auVar82 = vfmadd231sd_fma(auVar82,auVar108,auVar86);
  auVar82 = vfmadd231sd_avx512f(auVar82,auVar85,auVar302);
  auVar82 = vfmadd231sd_fma(auVar82,auVar84,auVar87);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = auVar118._0_8_;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = dVar94;
  auVar91 = vmulsd_avx512f(auVar306,auVar303);
  auVar309._8_8_ = 0;
  auVar309._0_8_ = auVar113._0_8_;
  auVar91 = vfmadd231sd_avx512f(auVar91,auVar292,auVar309);
  auVar82 = vfmadd231sd_fma(auVar82,auVar64,auVar91);
  auVar313._8_8_ = 0;
  auVar313._0_8_ = dVar95;
  auVar92 = vmulsd_avx512f(auVar313,auVar270);
  auVar92 = vmulsd_avx512f(auVar313,auVar92);
  local_2f20 = auVar82._0_8_;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar93 * dVar1;
  auVar82 = vfmadd231sd_fma(auVar92,auVar290,auVar274);
  auVar310._8_8_ = 0;
  auVar310._0_8_ = auVar128._0_8_;
  auVar81 = vmulsd_avx512f(auVar310,auVar81);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = dVar93 * dVar62;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar95;
  auVar82 = vfmadd213sd_avx512f(auVar275,auVar314,auVar82);
  auVar81 = vfmadd213sd_avx512f(auVar81,auVar310,auVar82);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar93 * auVar84._0_8_;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = auVar128._0_8_;
  auVar81 = vfmadd213sd_avx512f(auVar276,auVar311,auVar81);
  auVar82 = vmulsd_avx512f(auVar314,auVar64);
  auVar81 = vfmadd213sd_avx512f(auVar82,auVar311,auVar81);
  local_2f18 = auVar81._0_8_;
  auVar81 = vmulsd_avx512f(auVar314,auVar88);
  auVar82 = vmulsd_avx512f(auVar306,auVar311);
  auVar81 = vfmadd231sd_fma(auVar81,auVar290,auVar90);
  auVar88 = vmulsd_avx512f(auVar298,auVar314);
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar95;
  auVar82 = vfmadd231sd_avx512f(auVar82,auVar315,auVar309);
  auVar88 = vfmadd231sd_avx512f(auVar88,auVar290,auVar306);
  local_2fb8 = auVar82._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar62;
  auVar81 = vfmadd231sd_fma(auVar81,auVar109,auVar88);
  local_2fa8 = auVar88._0_8_;
  auVar88 = vmulsd_avx512f(auVar298,auVar311);
  auVar88 = vfmadd231sd_avx512f(auVar88,auVar290,auVar309);
  auVar312._8_8_ = 0;
  auVar312._0_8_ = auVar128._0_8_;
  auVar81 = vfmadd231sd_avx512f(auVar81,auVar312,auVar85);
  local_2fb0 = auVar88._0_8_;
  auVar81 = vfmadd231sd_fma(auVar81,auVar84,auVar88);
  auVar81 = vfmadd231sd_fma(auVar81,auVar64,auVar82);
  local_2f10 = auVar81._0_8_;
  auVar81 = vmulsd_avx512f(auVar292,auVar83);
  auVar81 = vmulsd_avx512f(auVar315,auVar81);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dVar277 * (dVar1 + dVar1);
  auVar81 = vfmadd231sd_fma(auVar81,auVar290,auVar249);
  auVar82 = vmulsd_avx512f(auVar288,auVar315);
  auVar82 = vfmadd231sd_fma(auVar82,auVar290,auVar292);
  auVar81 = vfmadd231sd_fma(auVar81,auVar82,auVar109);
  auVar88 = vmulsd_avx512f(auVar303,auVar89);
  local_2fc0 = auVar82._0_8_;
  auVar82 = vmulsd_avx512f(auVar288,auVar312);
  auVar82 = vfmadd231sd_avx512f(auVar82,auVar290,auVar303);
  auVar81 = vfmadd213sd_avx512f(auVar88,auVar312,auVar81);
  local_2fc8 = auVar82._0_8_;
  auVar81 = vfmadd231sd_fma(auVar81,auVar82,auVar84);
  auVar82 = vmulsd_avx512f(auVar292,auVar312);
  auVar82 = vfmadd231sd_avx512f(auVar82,auVar315,auVar303);
  auVar81 = vfmadd231sd_fma(auVar81,auVar82,auVar64);
  local_2fd0 = auVar82._0_8_;
  local_2f08 = auVar81._0_8_;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_> *)&local_2880);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)&this->m_element->m_d;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)local_2f80;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((Matrix<double,_1,_3,_1,_1,_3> *)local_2e98,
             (Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>
              *)local_1d40);
  for (lVar79 = 0; lVar79 != 8; lVar79 = lVar79 + 1) {
    for (lVar75 = 0; lVar75 != 3; lVar75 = lVar75 + 1) {
      pSVar67 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          (local_2e98,0,lVar75);
      dVar1 = *pSVar67;
      pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                           lVar79);
      dVar60 = *pSVar68;
      pSVar69 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1> *)&local_2d80
                           ,0,lVar78 + lVar75);
      *pSVar69 = dVar1 * dVar60;
    }
    lVar78 = lVar78 + 3;
  }
  lVar78 = 0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1d40,&local_2880,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1d40,&local_2d80);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)&this->m_element->m_d;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)local_2f00;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((Matrix<double,_1,_3,_1,_1,_3> *)local_2e98,
             (Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>
              *)local_1d40);
  for (lVar79 = 0; lVar79 != 8; lVar79 = lVar79 + 1) {
    for (lVar75 = 0; lVar75 != 3; lVar75 = lVar75 + 1) {
      pSVar67 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          (local_2e98,0,lVar75);
      dVar1 = *pSVar67;
      pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                           lVar79);
      dVar60 = *pSVar68;
      pSVar69 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1> *)&local_2d80
                           ,0,lVar78 + lVar75);
      *pSVar69 = dVar1 * dVar60;
    }
    lVar78 = lVar78 + 3;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1d40,&local_2880,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1d40,&local_2d80);
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)&this->m_element->m_d;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)local_2f80;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            (&local_2de8,
             (Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>
              *)local_1d40);
  lVar79 = 0;
  for (lVar78 = 0; lVar78 != 8; lVar78 = lVar78 + 1) {
    for (lVar75 = 0; lVar75 != 3; lVar75 = lVar75 + 1) {
      pSVar67 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          (local_2e98,0,lVar75);
      SVar2 = *pSVar67;
      pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                           lVar78);
      SVar3 = *pSVar68;
      pSVar67 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&local_2de8,0
                           ,lVar75);
      dVar1 = *pSVar67;
      pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                           lVar78);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = SVar3;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = SVar2;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = dVar1 * *pSVar68;
      auVar81 = vfmadd231sd_fma(auVar173,auVar110,auVar5);
      pSVar69 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1> *)&local_2d80
                           ,0,lVar79 + lVar75);
      *pSVar69 = auVar81._0_8_;
    }
    lVar79 = lVar79 + 3;
  }
  lVar78 = 2;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1d40,&local_2880,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1d40,&local_2d80);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_> *)&local_2d80);
  lVar75 = 0;
  for (lVar79 = 0; lVar79 != 4; lVar79 = lVar79 + 1) {
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2c80,
                         lVar75);
    Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true> *)&local_2400,
               &this->m_element->m_strainANS_D,lVar79);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>
                      *)local_1d40,pSVar68,(StorageBaseType *)&local_2400);
    Eigen::MatrixBase<Eigen::Matrix<double,1,24,1,1,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_2d80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>_>
                *)local_1d40);
    lVar75 = lVar75 + 2;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1d40,&local_2880,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1d40,&local_2d80);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_> *)&local_2d80);
  uVar76 = 0;
  while (bVar80 = lVar78 != 0, lVar78 = lVar78 + -1, bVar80) {
    pSVar70 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *)local_2fa0,0,
                         uVar76 | 2);
    Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true> *)&local_2400,
               &this->m_element->m_strainANS_D,uVar76 | 6);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>
                      *)local_1d40,pSVar70,(StorageBaseType *)&local_2400);
    Eigen::MatrixBase<Eigen::Matrix<double,1,24,1,1,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_2d80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>_>
                *)local_1d40);
    uVar76 = uVar76 + 1;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1d40,&local_2880,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1d40,&local_2d80);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_> *)&local_2d80);
  lVar78 = 2;
  uVar76 = 0;
  while (bVar80 = lVar78 != 0, lVar78 = lVar78 + -1, bVar80) {
    pSVar70 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *)local_2fa0,0,
                         uVar76);
    Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true> *)&local_2400,
               &this->m_element->m_strainANS_D,uVar76 | 4);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>
                      *)local_1d40,pSVar70,(StorageBaseType *)&local_2400);
    Eigen::MatrixBase<Eigen::Matrix<double,1,24,1,1,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_2d80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>_>
                *)local_1d40);
    uVar76 = uVar76 + 1;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_1d40,&local_2880,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_1d40,&local_2d80);
  for (lVar78 = 0; lVar78 != 0x18; lVar78 = lVar78 + 1) {
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,0
                         ,lVar78);
    dVar1 = *pSVar71;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,1
                         ,lVar78);
    auVar235._8_8_ = 0;
    auVar235._0_8_ = dVar97 * dVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar97;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = dVar94 * dVar94 * *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar111,auVar235,auVar6);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,2
                         ,lVar78);
    auVar174._8_8_ = 0;
    auVar174._0_8_ = auVar81._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar94;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = dVar97 * *pSVar71;
    auVar81 = vfmadd132sd_fma(auVar112,auVar174,auVar7);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,3
                         ,lVar78);
    auVar113._8_8_ = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auVar81._0_8_;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = auVar113._0_8_ * *pSVar71;
    auVar81 = vfmadd213sd_fma(auVar175,auVar113,auVar8);
    auVar176._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,4
                         ,lVar78);
    auVar176._8_8_ = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar113._0_8_;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = dVar97 * *pSVar71;
    auVar81 = vfmadd132sd_fma(auVar114,auVar176,auVar9);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,5
                         ,lVar78);
    auVar177._8_8_ = 0;
    auVar177._0_8_ = auVar81._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar113._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = dVar94 * *pSVar71;
    auVar81 = vfmadd132sd_fma(auVar115,auVar177,auVar10);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,0,lVar78);
    *pSVar71 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,0
                         ,lVar78);
    dVar1 = *pSVar71;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,1
                         ,lVar78);
    auVar236._8_8_ = 0;
    auVar236._0_8_ = dVar277 * dVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar277;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = dVar96 * dVar96 * *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar116,auVar236,auVar11);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,2
                         ,lVar78);
    auVar178._8_8_ = 0;
    auVar178._0_8_ = auVar81._0_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar96;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = dVar277 * *pSVar71;
    auVar81 = vfmadd132sd_fma(auVar117,auVar178,auVar12);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,3
                         ,lVar78);
    auVar118._8_8_ = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar81._0_8_;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = auVar118._0_8_ * *pSVar71;
    auVar81 = vfmadd213sd_fma(auVar179,auVar118,auVar13);
    auVar180._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,4
                         ,lVar78);
    auVar180._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar118._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = dVar277 * *pSVar71;
    auVar81 = vfmadd132sd_fma(auVar119,auVar180,auVar14);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,5
                         ,lVar78);
    auVar181._8_8_ = 0;
    auVar181._0_8_ = auVar81._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auVar118._0_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = dVar96 * *pSVar71;
    auVar81 = vfmadd132sd_fma(auVar120,auVar181,auVar15);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,1,lVar78);
    *pSVar71 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,0
                         ,lVar78);
    dVar1 = *pSVar71;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,1
                         ,lVar78);
    auVar182._8_8_ = 0;
    auVar182._0_8_ = (dVar1 + dVar1) * dVar97;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar277;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = (*pSVar71 + *pSVar71) * dVar94 * dVar96;
    auVar81 = vfmadd231sd_fma(auVar121,auVar182,auVar16);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,2
                         ,lVar78);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = auVar86._0_8_;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = auVar81._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar183,auVar122,auVar17);
    auVar184._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,3
                         ,lVar78);
    auVar184._8_8_ = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar118._0_8_;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (*pSVar71 + *pSVar71) * auVar113._0_8_;
    auVar81 = vfmadd132sd_fma(auVar123,auVar184,auVar18);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,4
                         ,lVar78);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = auVar87._0_8_;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = auVar81._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar185,auVar124,auVar19);
    auVar186._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,5
                         ,lVar78);
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auVar91._0_8_;
    auVar186._8_8_ = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar186,auVar125,auVar20);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,2,lVar78);
    *pSVar71 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,0
                         ,lVar78);
    dVar1 = *pSVar71;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,1
                         ,lVar78);
    auVar237._8_8_ = 0;
    auVar237._0_8_ = dVar93 * dVar1;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar93;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = dVar95 * dVar95 * *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar126,auVar237,auVar21);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,2
                         ,lVar78);
    auVar187._8_8_ = 0;
    auVar187._0_8_ = auVar81._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar95;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = dVar93 * *pSVar71;
    auVar81 = vfmadd132sd_fma(auVar127,auVar187,auVar22);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,3
                         ,lVar78);
    auVar128._8_8_ = 0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar81._0_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = auVar128._0_8_ * *pSVar71;
    auVar81 = vfmadd213sd_fma(auVar188,auVar128,auVar23);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,4
                         ,lVar78);
    auVar189._8_8_ = 0;
    auVar189._0_8_ = auVar128._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar81._0_8_;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = dVar93 * *pSVar71;
    auVar81 = vfmadd213sd_fma(auVar129,auVar189,auVar24);
    auVar238._8_8_ = 0;
    auVar238._0_8_ =
         dVar95 * local_2880.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.
                  m_storage.m_data.array[5];
    auVar81 = vfmadd213sd_fma(auVar238,auVar189,auVar81);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,3,lVar78);
    *pSVar71 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,0
                         ,lVar78);
    dVar1 = *pSVar71;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,1
                         ,lVar78);
    auVar190._8_8_ = 0;
    auVar190._0_8_ = (dVar1 + dVar1) * dVar97;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar93;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = (*pSVar71 + *pSVar71) * dVar94 * dVar95;
    auVar81 = vfmadd231sd_fma(auVar130,auVar190,auVar25);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,2
                         ,lVar78);
    auVar131._8_8_ = 0;
    auVar131._0_8_ = local_2fa8;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = auVar81._0_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar191,auVar131,auVar26);
    auVar192._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,3
                         ,lVar78);
    auVar192._8_8_ = 0;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar128._0_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = (*pSVar71 + *pSVar71) * auVar113._0_8_;
    auVar81 = vfmadd132sd_fma(auVar132,auVar192,auVar27);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,4
                         ,lVar78);
    auVar133._8_8_ = 0;
    auVar133._0_8_ = local_2fb0;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = auVar81._0_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar193,auVar133,auVar28);
    auVar194._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,5
                         ,lVar78);
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_2fb8;
    auVar194._8_8_ = 0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar194,auVar134,auVar29);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,4,lVar78);
    *pSVar71 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,0
                         ,lVar78);
    dVar1 = *pSVar71;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,1
                         ,lVar78);
    auVar195._8_8_ = 0;
    auVar195._0_8_ = (dVar1 + dVar1) * dVar277;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar93;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = (*pSVar71 + *pSVar71) * dVar96 * dVar95;
    auVar81 = vfmadd231sd_fma(auVar135,auVar195,auVar30);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,2
                         ,lVar78);
    auVar136._8_8_ = 0;
    auVar136._0_8_ = local_2fc0;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = auVar81._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar196,auVar136,auVar31);
    auVar197._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,3
                         ,lVar78);
    auVar197._8_8_ = 0;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auVar128._0_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = (*pSVar71 + *pSVar71) * auVar118._0_8_;
    auVar81 = vfmadd132sd_fma(auVar137,auVar197,auVar32);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,4
                         ,lVar78);
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_2fc8;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = auVar81._0_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar198,auVar138,auVar33);
    auVar199._0_8_ = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_2880,5
                         ,lVar78);
    auVar139._8_8_ = 0;
    auVar139._0_8_ = local_2fd0;
    auVar199._8_8_ = 0;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *pSVar71;
    auVar81 = vfmadd231sd_fma(auVar199,auVar139,auVar34);
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,5,lVar78);
    *pSVar71 = auVar81._0_8_;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_> *)&local_2400);
  lVar78 = 0;
  for (lVar79 = 0; lVar79 != 8; lVar79 = lVar79 + 1) {
    uVar65 = local_3060._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    dVar1 = dStack_3048;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    uVar76 = local_3030;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = SVar3;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar65;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = dVar1 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar140,auVar200,auVar35);
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar76;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = auVar81._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar141,auVar201,auVar36);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,0
                         ,lVar78);
    *pSVar72 = auVar81._0_8_;
    uVar65 = local_3060._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    dVar1 = dStack_3048;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    uVar76 = local_3030;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = SVar3;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar65;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = dVar1 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar142,auVar202,auVar37);
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar76;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = auVar81._0_8_;
    lVar75 = lVar78 + 1;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar143,auVar203,auVar38);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,1
                         ,lVar75);
    *pSVar72 = auVar81._0_8_;
    uVar65 = local_3060._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    dVar1 = dStack_3048;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    uVar76 = local_3030;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = SVar3;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar65;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = dVar1 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar144,auVar204,auVar39);
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar76;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = auVar81._0_8_;
    col = lVar78 + 2;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar145,auVar205,auVar40);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,2
                         ,col);
    *pSVar72 = auVar81._0_8_;
    uVar65 = local_3060._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    uVar66 = local_3040._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    auVar206._8_8_ = 0;
    auVar206._0_8_ = SVar3;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar65;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = (double)uVar66 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar146,auVar206,auVar41);
    uVar65 = local_3028._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar65;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = auVar81._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar147,auVar207,auVar42);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,3
                         ,lVar78);
    *pSVar72 = auVar81._0_8_;
    uVar65 = local_3060._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    uVar66 = local_3040._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    auVar208._8_8_ = 0;
    auVar208._0_8_ = SVar3;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar65;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = (double)uVar66 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar148,auVar208,auVar43);
    uVar65 = local_3028._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar65;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = auVar81._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar149,auVar209,auVar44);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,4
                         ,lVar75);
    *pSVar72 = auVar81._0_8_;
    uVar65 = local_3060._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    uVar66 = local_3040._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    auVar210._8_8_ = 0;
    auVar210._0_8_ = SVar3;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar65;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = (double)uVar66 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar150,auVar210,auVar45);
    uVar65 = local_3028._0_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar65;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = auVar81._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar151,auVar211,auVar46);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,5
                         ,col);
    *pSVar72 = auVar81._0_8_;
    uVar76 = uStack_3050;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    uVar65 = local_3040._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    auVar212._8_8_ = 0;
    auVar212._0_8_ = SVar3;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar76;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = (double)uVar65 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar152,auVar212,auVar47);
    uVar65 = local_3028._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar65;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = auVar81._0_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar153,auVar213,auVar48);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,6
                         ,lVar78);
    *pSVar72 = auVar81._0_8_;
    uVar76 = uStack_3050;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    uVar65 = local_3040._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    auVar214._8_8_ = 0;
    auVar214._0_8_ = SVar3;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar76;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = (double)uVar65 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar154,auVar214,auVar49);
    uVar65 = local_3028._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar65;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = auVar81._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar155,auVar215,auVar50);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,7
                         ,lVar75);
    *pSVar72 = auVar81._0_8_;
    uVar76 = uStack_3050;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f80,0,
                         lVar79);
    SVar3 = *pSVar68;
    uVar65 = local_3040._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_2f00,0,
                         lVar79);
    auVar216._8_8_ = 0;
    auVar216._0_8_ = SVar3;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar76;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = (double)uVar65 * *pSVar68;
    auVar81 = vfmadd231sd_fma(auVar156,auVar216,auVar51);
    uVar65 = local_3028._8_8_;
    pSVar68 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_2e80,0,
                         lVar79);
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar65;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = auVar81._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *pSVar68;
    auVar81 = vfmadd132sd_fma(auVar157,auVar217,auVar52);
    pSVar72 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>,_1> *)&local_2400,8
                         ,col);
    lVar78 = lVar78 + 3;
    *pSVar72 = auVar81._0_8_;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_2f30,
             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_2c20);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_3010);
  lVar78 = 0;
  while (lVar78 != 0x18) {
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,0,lVar78);
    SVar4 = *pSVar71;
    pSVar73 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar78);
    auVar158._8_8_ = 0;
    auVar158._0_8_ = *pSVar73;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = SVar4;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_3010;
    auVar81 = vfmadd213sd_fma(auVar158,auVar218,auVar53);
    local_3010 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,1,lVar78);
    SVar4 = *pSVar71;
    pSVar73 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar78);
    auVar159._8_8_ = 0;
    auVar159._0_8_ = *pSVar73;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = SVar4;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_3008;
    auVar81 = vfmadd213sd_fma(auVar159,auVar219,auVar54);
    local_3008 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,2,lVar78);
    SVar4 = *pSVar71;
    pSVar73 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar78);
    auVar160._8_8_ = 0;
    auVar160._0_8_ = *pSVar73;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = SVar4;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_3000;
    auVar81 = vfmadd213sd_fma(auVar160,auVar220,auVar55);
    local_3000 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,3,lVar78);
    SVar4 = *pSVar71;
    pSVar73 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar78);
    auVar161._8_8_ = 0;
    auVar161._0_8_ = *pSVar73;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = SVar4;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_2ff8;
    auVar81 = vfmadd213sd_fma(auVar161,auVar221,auVar56);
    local_2ff8 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,4,lVar78);
    SVar4 = *pSVar71;
    pSVar73 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar78);
    auVar162._8_8_ = 0;
    auVar162._0_8_ = *pSVar73;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = SVar4;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_2ff0;
    auVar81 = vfmadd213sd_fma(auVar162,auVar222,auVar57);
    local_2ff0 = auVar81._0_8_;
    pSVar71 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        (local_b40,5,lVar78);
    SVar4 = *pSVar71;
    pSVar73 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar78);
    auVar163._8_8_ = 0;
    auVar163._0_8_ = *pSVar73;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = SVar4;
    lVar78 = lVar78 + 1;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_2fe8;
    auVar81 = vfmadd213sd_fma(auVar163,auVar223,auVar58);
    local_2fe8 = auVar81._0_8_;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)local_1d40,(MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_3010,
             &this->m_element->m_Alpha);
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_2f30,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
              *)local_1d40);
  std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
             local_1d40,
             &(this->m_element->m_layers).
              super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_material.
              super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>);
  pCVar77 = (ChMatrixNM<double,_6,_6> *)
            ((long)local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.
                   m_storage.m_data.array[0] + 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage
              .m_data.array + 1));
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[0] = (double)pCVar77;
  local_1d40[0].super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
  array[1] = (double)local_2f30;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_2a90,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)local_1d40);
  Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_300);
  local_300[0] = local_2a90;
  local_2b0 = local_2a90;
  local_260 = local_2a90;
  local_2e8 = local_2a80;
  local_298 = local_2a80;
  local_248 = local_2a80;
  local_2d0 = local_2a70;
  local_280 = local_2a70;
  local_230 = local_2a70;
  local_228 = local_2a80;
  local_1d8 = local_2a80;
  local_188 = local_2a80;
  local_210 = local_2a88;
  local_1c0 = local_2a88;
  local_170 = local_2a88;
  local_1f8 = local_2a68;
  local_1a8 = local_2a68;
  local_158 = local_2a68;
  local_150 = local_2a70;
  local_100 = local_2a70;
  local_b0 = local_2a70;
  local_138 = local_2a68;
  local_e8 = local_2a68;
  local_98 = local_2a68;
  local_120 = local_2a78;
  local_d0 = local_2a78;
  local_80 = local_2a78;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = this->m_Rfactor;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = this->m_element->m_Alpha;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = this->m_Kfactor;
  auVar81 = vfmadd213sd_fma(auVar224,auVar164,auVar59);
  local_2f00._72_8_ = auVar81._0_8_;
  local_2eb0 = local_b40;
  local_2ea8 = pCVar77;
  local_2ea0 = local_b40;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_24,_1,_6,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
               *)local_2db8,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>>
               *)&local_2eb0,(double *)(local_2f00 + 0x48));
  local_2b98 = &local_2400;
  local_2b90 = (DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_300;
  local_2b88 = local_2b98;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,0>>
  ::operator*(&local_2e18,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,0>>
               *)&local_2b98,&this->m_Kfactor);
  local_6c0[0].m_lhs.m_lhs.m_rhs = (RhsNested)local_2db8._16_8_;
  local_6c0[0].m_lhs.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_2db8._0_8_;
  local_6c0[0].m_lhs.m_lhs.m_lhs.m_rhs = (RhsNested)local_2db8._8_8_;
  local_6c0[0].m_lhs.m_rhs.m_functor.m_other = local_2d98.m_other;
  local_6c0[0].m_rhs.m_lhs.m_lhs.m_lhs.m_matrix = local_2e18.m_lhs.m_lhs.m_lhs.m_matrix;
  local_6c0[0].m_rhs.m_lhs.m_lhs.m_rhs = local_2e18.m_lhs.m_lhs.m_rhs;
  local_6c0[0].m_rhs.m_lhs.m_rhs = local_2e18.m_lhs.m_rhs;
  local_6c0[0].m_rhs.m_rhs.m_functor.m_other = local_2e18.m_rhs.m_functor.m_other;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,24,24,1,24,24>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,24,1,24,24>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,24,1,24,24>const>const>const>>
            ((Matrix<double,_24,_24,_1,_24,_24> *)local_1d40,local_6c0);
  local_6c0[0]._0_8_ = local_3018 * this->m_element->m_GaussScaling;
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)local_1d40,(Scalar *)local_6c0)
  ;
  local_2e18.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_2a60;
  local_2eb0 = (DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)
               (local_3018 * this->m_element->m_GaussScaling);
  local_2e18.m_lhs.m_lhs.m_rhs = (RhsNested)pCVar77;
  local_2e18.m_lhs.m_rhs = (RhsNested)local_b40;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,5,1,6,5>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_24,_1,_6,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_24,_1,_5,_24>_>_>
               *)local_2db8,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,5,1,6,5>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>>
               *)&local_2e18,(double *)&local_2eb0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,5,24,1,5,24>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,5,1,6,5>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,24,1,5,24>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,5,24,1,5,24>> *)local_6c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_24,_1,_6,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_24,_1,_5,_24>_>_>_>
              *)local_2db8);
  vector = local_2fd8;
  local_2e18.m_lhs.m_lhs.m_lhs.m_matrix = local_1d40;
  Eigen::VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,__1> *)local_2db8,local_2fd8,0,
             0x240);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,696,1,0,696,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,576,1,0,576,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_696,_1,_0,_696,_1>,__1,_1,_false> *)local_2db8,
             (Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_2e18);
  local_2e18.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_6c0;
  Eigen::VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_696,_1,_0,_696,_1>,__1> *)local_2db8,vector,0x240,
             0x78);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,696,1,0,696,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,120,1,0,120,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_696,_1,_0,_696,_1>,__1,_1,_false> *)local_2db8,
             (Map<Eigen::Matrix<double,_120,_1,_0,_120,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_2e18);
  return;
}

Assistant:

void ShellANCF_Jacobian::Evaluate(ChVectorN<double, 696>& result, const double x, const double y, const double z) {
    // Element shape function
    ChElementShellANCF_3423::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    // Determinant of position vector gradient matrix: Initial configuration
    ChElementShellANCF_3423::ShapeVector Nx;
    ChElementShellANCF_3423::ShapeVector Ny;
    ChElementShellANCF_3423::ShapeVector Nz;
    ChMatrixNM<double, 1, 3> Nx_d0;
    ChMatrixNM<double, 1, 3> Ny_d0;
    ChMatrixNM<double, 1, 3> Nz_d0;
    double detJ0 = m_element->Calc_detJ0(x, y, z, Nx, Ny, Nz, Nx_d0, Ny_d0, Nz_d0);

    // ANS shape function
    ChMatrixNM<double, 1, 4> S_ANS;  // Shape function vector for Assumed Natural Strain
    ChMatrixNM<double, 6, 5> M;      // Shape function vector for Enhanced Assumed Strain
    m_element->ShapeFunctionANSbilinearShell(S_ANS, x, y);
    m_element->Basis_M(M, x, y, z);

    // Transformation : Orthogonal transformation (A and J)
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    // Direction for orthotropic material
    double theta = m_element->GetLayer(m_kl).Get_theta();  // Fiber angle
    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(theta) + A2 * sin(theta);
    AA2 = -A1 * sin(theta) + A2 * cos(theta);
    AA3 = A3;

    /// Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    // Calculates inverse of rd0 (j0) (position vector gradient: Initial Configuration)
    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= detJ0;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    // Coefficients of contravariant transformation
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Transformation matrix, function of fiber angle
    const ChMatrixNM<double, 6, 6>& T0 = m_element->GetLayer(m_kl).Get_T0();
    // Determinant of the initial position vector gradient at the element center
    double detJ0C = m_element->GetLayer(m_kl).Get_detJ0C();

    // Enhanced Assumed Strain
    ChMatrixNM<double, 6, 5> G = T0 * M * (detJ0C / detJ0);
    ChVectorN<double, 6> strain_EAS = G * m_element->m_alphaEAS[m_kl];

    ChVectorN<double, 8> ddNx = m_element->m_ddT * Nx.transpose();
    ChVectorN<double, 8> ddNy = m_element->m_ddT * Ny.transpose();

    ChVectorN<double, 8> d0d0Nx = m_element->m_d0d0T * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = m_element->m_d0d0T * Ny.transpose();

    // Strain component
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * ((Nx * ddNx)(0, 0) - (Nx * d0d0Nx)(0, 0));
    strain_til(1) = 0.5 * ((Ny * ddNy)(0, 0) - (Ny * d0d0Ny)(0, 0));
    strain_til(2) = (Nx * ddNy)(0, 0) - (Nx * d0d0Ny)(0, 0);
    strain_til(3) = N(0) * m_element->m_strainANS(0) + N(2) * m_element->m_strainANS(1) +
                    N(4) * m_element->m_strainANS(2) + N(6) * m_element->m_strainANS(3);
    strain_til(4) = S_ANS(0, 2) * m_element->m_strainANS(6) + S_ANS(0, 3) * m_element->m_strainANS(7);
    strain_til(5) = S_ANS(0, 0) * m_element->m_strainANS(4) + S_ANS(0, 1) * m_element->m_strainANS(5);

    // For orthotropic material
    ChVectorN<double, 6> strain;

    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    // Strain derivative component

    ChMatrixNM<double, 6, 24> strainD_til;
    strainD_til.setZero();

    ChMatrixNM<double, 1, 24> tempB;
    ChMatrixNM<double, 1, 3> tempB3;
    ChMatrixNM<double, 1, 3> tempB31;

    tempB3 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i);
        }
    }
    strainD_til.row(0) = tempB;

    tempB3 = Ny * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(1) = tempB;

    tempB31 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i) + tempB31(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(2) = tempB;

    tempB.setZero();
    for (int i = 0; i < 4; i++) {
        tempB += N(i * 2) * m_element->m_strainANS_D.row(i);
    }
    strainD_til.row(3) = tempB;  // strainD for zz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i + 2) * m_element->m_strainANS_D.row(i + 6);
    }
    strainD_til.row(4) = tempB;  // strainD for xz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i) * m_element->m_strainANS_D.row(i + 4);
    }
    strainD_til.row(5) = tempB;  // strainD for yz

    //// For orthotropic material
    ChMatrixNM<double, 6, 24> strainD;  // Derivative of the strains w.r.t. the coordinates. Includes orthotropy
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    /// Gd : Jacobian (w.r.t. coordinates) of the initial position vector gradient matrix
    ChMatrixNM<double, 9, 24> Gd;
    Gd.setZero();

    for (int ii = 0; ii < 8; ii++) {
        Gd(0, 3 * ii) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);
        Gd(1, 3 * ii + 1) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);
        Gd(2, 3 * ii + 2) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);

        Gd(3, 3 * ii) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);
        Gd(4, 3 * ii + 1) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);
        Gd(5, 3 * ii + 2) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);

        Gd(6, 3 * ii) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
        Gd(7, 3 * ii + 1) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
        Gd(8, 3 * ii + 2) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
    }

    // Enhanced Assumed Strain 2nd
    strain += strain_EAS;

    // Structural damping
    // Strain time derivative for structural damping
    ChVectorN<double, 6> DEPS;
    DEPS.setZero();
    for (int ii = 0; ii < 24; ii++) {
        DEPS(0) += strainD(0, ii) * m_element->m_d_dt(ii);
        DEPS(1) += strainD(1, ii) * m_element->m_d_dt(ii);
        DEPS(2) += strainD(2, ii) * m_element->m_d_dt(ii);
        DEPS(3) += strainD(3, ii) * m_element->m_d_dt(ii);
        DEPS(4) += strainD(4, ii) * m_element->m_d_dt(ii);
        DEPS(5) += strainD(5, ii) * m_element->m_d_dt(ii);
    }

    // Add structural damping
    strain += DEPS * m_element->m_Alpha;

    // Matrix of elastic coefficients: The input assumes the material *could* be orthotropic
    const ChMatrixNM<double, 6, 6>& E_eps = m_element->GetLayer(m_kl).GetMaterial()->Get_E_eps();

    // Stress tensor calculation
    ChVectorN<double, 6> stress = E_eps * strain;

    // Declaration and computation of Sigm, to be removed
    ChMatrixNM<double, 9, 9> Sigm;  ///< Rearrangement of stress vector (not always needed)
    Sigm.setZero();

    Sigm(0, 0) = stress(0);  // XX
    Sigm(1, 1) = stress(0);
    Sigm(2, 2) = stress(0);

    Sigm(0, 3) = stress(2);  // XY
    Sigm(1, 4) = stress(2);
    Sigm(2, 5) = stress(2);

    Sigm(0, 6) = stress(4);  // XZ
    Sigm(1, 7) = stress(4);
    Sigm(2, 8) = stress(4);

    Sigm(3, 0) = stress(2);  // XY
    Sigm(4, 1) = stress(2);
    Sigm(5, 2) = stress(2);

    Sigm(3, 3) = stress(1);  // YY
    Sigm(4, 4) = stress(1);
    Sigm(5, 5) = stress(1);

    Sigm(3, 6) = stress(5);  // YZ
    Sigm(4, 7) = stress(5);
    Sigm(5, 8) = stress(5);

    Sigm(6, 0) = stress(4);  // XZ
    Sigm(7, 1) = stress(4);
    Sigm(8, 2) = stress(4);

    Sigm(6, 3) = stress(5);  // YZ
    Sigm(7, 4) = stress(5);
    Sigm(8, 5) = stress(5);

    Sigm(6, 6) = stress(3);  // ZZ
    Sigm(7, 7) = stress(3);
    Sigm(8, 8) = stress(3);

    // Jacobian of internal forces (excluding the EAS contribution).
    ChMatrixNM<double, 24, 24> KTE;
    KTE = (strainD.transpose() * E_eps * strainD) * (m_Kfactor + m_Rfactor * m_element->m_Alpha) +
          (Gd.transpose() * Sigm * Gd) * m_Kfactor;
    KTE *= detJ0 * m_element->m_GaussScaling;

    // EAS cross-dependency matrix.
    ChMatrixNM<double, 5, 24> GDEPSP = (G.transpose() * E_eps * strainD) * (detJ0 * m_element->m_GaussScaling);

    // Load result vector (integrand)
    result.segment(0, 24 * 24) = Eigen::Map<ChVectorN<double, 24 * 24>>(KTE.data(), 24 * 24);
    result.segment(576, 5 * 24) = Eigen::Map<ChVectorN<double, 5 * 24>>(GDEPSP.data(), 5 * 24);
}